

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *this_00;
  Mat *this_01;
  Mat *this_02;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_03;
  float fVar1;
  float fVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  int iVar5;
  size_t sVar6;
  Layer *pLVar7;
  Option *pOVar8;
  ulong uVar9;
  int iVar10;
  int i;
  long lVar11;
  int g;
  long local_630;
  Mat weight_data_g;
  Mat int8_weight_data;
  Mat int8_weight_data_g;
  Option opt;
  ParamDict pd;
  
  (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->weight_data_size,0);
  this_00 = &this->weight_data;
  Mat::operator=(this_00,(Mat *)&pd);
  Mat::~Mat((Mat *)&pd);
  iVar10 = -100;
  if ((this_00->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->num_output,1);
      Mat::operator=(&this->bias_data,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term == 2) {
      (**mb->_vptr_ModelBin)(&pd,mb,1);
      this_01 = &this->weight_data_int8_scales;
      Mat::operator=(this_01,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      (**mb->_vptr_ModelBin)(&pd,mb,1);
      this_02 = &this->bottom_blob_int8_scales;
      Mat::operator=(this_02,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      fVar1 = *(this->weight_data_int8_scales).data;
      Mat::Mat((Mat *)&pd,this->group,4,(Allocator *)0x0);
      Mat::operator=(this_01,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      Mat::fill(this_01,fVar1);
      fVar1 = *(this->bottom_blob_int8_scales).data;
      Mat::Mat((Mat *)&pd,this->group,4,(Allocator *)0x0);
      Mat::operator=(this_02,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      Mat::fill(this_02,fVar1);
    }
    else if (this->int8_scale_term == 1) {
      (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->group,1);
      Mat::operator=(&this->weight_data_int8_scales,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
      (**mb->_vptr_ModelBin)(&pd,mb,(ulong)(uint)this->group,1);
      Mat::operator=(&this->bottom_blob_int8_scales,(Mat *)&pd);
      Mat::~Mat((Mat *)&pd);
    }
    lVar11 = 0;
    while( true ) {
      ppLVar3 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppLVar4 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3) <= lVar11) break;
      if (ppLVar3[lVar11] != (Layer *)0x0) {
        (*ppLVar3[lVar11]->_vptr_Layer[1])();
      }
      lVar11 = lVar11 + 1;
    }
    if (ppLVar4 != ppLVar3) {
      (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar3;
    }
    this_03 = &this->dequantize_ops;
    lVar11 = 0;
    while( true ) {
      ppLVar3 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppLVar4 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppLVar4 - (long)ppLVar3) >> 3) <= lVar11) break;
      if (ppLVar3[lVar11] != (Layer *)0x0) {
        (*ppLVar3[lVar11]->_vptr_Layer[1])();
      }
      lVar11 = lVar11 + 1;
    }
    if (ppLVar4 != ppLVar3) {
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppLVar3;
    }
    sVar6 = (this->weight_data).elemsize;
    if (sVar6 == 1) {
      if (this->use_int8_inference == false) {
        fwrite("quantized int8 weight loaded but use_int8_inference disabled\n",0x3d,1,_stderr);
        return -1;
      }
    }
    else if ((sVar6 == 4) && (this->use_int8_inference == true)) {
      Mat::Mat(&int8_weight_data,this->weight_data_size,1,(Allocator *)0x0);
      if ((int8_weight_data.data == (void *)0x0) ||
         ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
        Mat::~Mat(&int8_weight_data);
        return -100;
      }
      iVar10 = this->group;
      iVar5 = this->weight_data_size / iVar10;
      sVar6 = (size_t)iVar5;
      local_630 = 0;
      for (lVar11 = 0; lVar11 < iVar10; lVar11 = lVar11 + 1) {
        pLVar7 = create_layer(0x39);
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,*(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4));
        (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
        pOVar8 = get_default_option();
        opt.lightmode = pOVar8->lightmode;
        opt._1_3_ = *(undefined3 *)&pOVar8->field_0x1;
        opt.num_threads = pOVar8->num_threads;
        opt.workspace_allocator = pOVar8->workspace_allocator;
        opt.blob_allocator = int8_weight_data.allocator;
        weight_data_g.elemsize = (this->weight_data).elemsize;
        weight_data_g.allocator = (this->weight_data).allocator;
        weight_data_g.data =
             (void *)(weight_data_g.elemsize * local_630 + (long)(this->weight_data).data);
        weight_data_g.refcount = (int *)0x0;
        int8_weight_data_g.dims = 1;
        weight_data_g.w = iVar5;
        weight_data_g.dims = 1;
        weight_data_g.h = 1;
        weight_data_g.c = 1;
        int8_weight_data_g.data =
             (void *)(int8_weight_data.elemsize * local_630 + (long)int8_weight_data.data);
        int8_weight_data_g.refcount = (int *)0x0;
        int8_weight_data_g.elemsize = int8_weight_data.elemsize;
        int8_weight_data_g.allocator = int8_weight_data.allocator;
        int8_weight_data_g.h = 1;
        int8_weight_data_g.c = 1;
        weight_data_g.cstep = sVar6;
        int8_weight_data_g.w = iVar5;
        int8_weight_data_g.cstep = sVar6;
        (*pLVar7->_vptr_Layer[5])(pLVar7,&weight_data_g,&int8_weight_data_g,&opt);
        (*pLVar7->_vptr_Layer[1])(pLVar7);
        Mat::~Mat(&int8_weight_data_g);
        Mat::~Mat(&weight_data_g);
        ParamDict::~ParamDict(&pd);
        iVar10 = this->group;
        local_630 = local_630 + sVar6;
      }
      Mat::operator=(this_00,&int8_weight_data);
      Mat::~Mat(&int8_weight_data);
    }
    iVar10 = 0;
    if (this->use_int8_inference == true) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (&this->quantize_ops,(long)this->group);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_03,(long)this->group);
      for (lVar11 = 0; uVar9 = (ulong)this->group, lVar11 < (long)uVar9; lVar11 = lVar11 + 1) {
        pLVar7 = create_layer(0x39);
        (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar7;
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,*(float *)((long)(this->bottom_blob_int8_scales).data + lVar11 * 4));
        (*(this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar11]->_vptr_Layer[2])();
        ParamDict::~ParamDict(&pd);
      }
      for (lVar11 = 0; lVar11 < (int)uVar9; lVar11 = lVar11 + 1) {
        pLVar7 = create_layer(0x3a);
        (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar7;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4);
        fVar2 = *(float *)((long)(this->bottom_blob_int8_scales).data + lVar11 * 4);
        ParamDict::ParamDict(&pd);
        ParamDict::set(&pd,0,1.0 / (fVar1 * fVar2));
        ParamDict::set(&pd,1,this->bias_term);
        ParamDict::set(&pd,2,1);
        pLVar7 = (this_03->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        (*pLVar7->_vptr_Layer[2])(pLVar7,&pd);
        int8_weight_data.dims = 0;
        int8_weight_data.w = 0;
        int8_weight_data.h = 0;
        int8_weight_data.c = 0;
        int8_weight_data.cstep = 0;
        int8_weight_data.elemsize = 0;
        int8_weight_data.allocator = (Allocator *)0x0;
        int8_weight_data.data = (void *)0x0;
        int8_weight_data.refcount = (int *)0x0;
        weight_data_g.elemsize = (this->bias_data).elemsize;
        weight_data_g.allocator = (this->bias_data).allocator;
        weight_data_g.data =
             (void *)(weight_data_g.elemsize * lVar11 + (long)(this->bias_data).data);
        weight_data_g.refcount = (int *)0x0;
        weight_data_g.dims = 1;
        weight_data_g.w = 1;
        weight_data_g.h = 1;
        weight_data_g.c = 1;
        weight_data_g.cstep = 1;
        Mat::operator=(&int8_weight_data,&weight_data_g);
        Mat::~Mat(&weight_data_g);
        pLVar7 = (this_03->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&weight_data_g,&int8_weight_data);
        (*pLVar7->_vptr_Layer[3])(pLVar7);
        Mat::~Mat(&int8_weight_data);
        ParamDict::~ParamDict(&pd);
        uVar9 = (ulong)(uint)this->group;
      }
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(group, 1);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            ncnn::Option opt = ncnn::get_default_option();
            opt.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}